

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushID(char *str_id_begin,char *str_id_end)

{
  int iVar1;
  ImGuiWindow *this;
  uint *puVar2;
  ImGuiID IVar3;
  uint *__dest;
  int iVar4;
  int iVar5;
  
  this = GImGui->CurrentWindow;
  IVar3 = ImGuiWindow::GetID(this,str_id_begin,str_id_end);
  iVar5 = (this->IDStack).Size;
  iVar1 = (this->IDStack).Capacity;
  if (iVar5 == iVar1) {
    iVar5 = iVar5 + 1;
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar1 < iVar5) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar5 << 2,GImAllocatorUserData);
      puVar2 = (this->IDStack).Data;
      if (puVar2 != (uint *)0x0) {
        memcpy(__dest,puVar2,(long)(this->IDStack).Size << 2);
        puVar2 = (this->IDStack).Data;
        if (puVar2 != (uint *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
      }
      (this->IDStack).Data = __dest;
      (this->IDStack).Capacity = iVar5;
    }
  }
  (this->IDStack).Data[(this->IDStack).Size] = IVar3;
  (this->IDStack).Size = (this->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id_begin, const char* str_id_end)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    window->IDStack.push_back(window->GetID(str_id_begin, str_id_end));
}